

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall soplex::SPxBasisBase<double>::SPxBasisBase(SPxBasisBase<double> *this,TYPE ttype)

{
  Timer *pTVar1;
  
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_003b14c8;
  this->theLP = (SPxSolverBase<double> *)0x0;
  (this->theBaseId).data = (SPxId *)0x0;
  (this->theBaseId).memFactor = 1.2;
  (this->theBaseId).thesize = 0;
  (this->theBaseId).themax = 1;
  spx_alloc<soplex::SPxId*>(&(this->theBaseId).data,1);
  (this->matrix).data = (SVectorBase<double> **)0x0;
  (this->matrix).memFactor = 1.2;
  (this->matrix).thesize = 0;
  (this->matrix).themax = 1;
  spx_alloc<soplex::SVectorBase<double>const**>(&(this->matrix).data,1);
  this->matrixIsSetup = false;
  this->factor = (SLinSolver<double> *)0x0;
  this->factorized = false;
  this->maxUpdates = 200;
  this->nonzeroFactor = 10.0;
  this->fillFactor = 5.0;
  this->memFactor = 1.5;
  this->iterCount = 0;
  this->lastIterCount = 0;
  this->iterDegenCheck = 0;
  this->updateCount = 0;
  this->totalUpdateCount = 0;
  this->nzCount = 1;
  this->lastMem = 0;
  this->lastFill = 0.0;
  this->lastNzCount = 0;
  this->theTime = (Timer *)0x0;
  this->timerType = ttype;
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = 0;
  this->minStab = 0.0;
  this->thestatus = NO_PROBLEM;
  Desc::Desc(&this->thedesc);
  this->freeSlinSolver = false;
  this->spxout = (SPxOut *)0x0;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->theTime = pTVar1;
  return;
}

Assistant:

SPxBasisBase<R>::SPxBasisBase(Timer::TYPE ttype)
   : theLP(nullptr)
   , matrixIsSetup(false)
   , factor(nullptr)
   , factorized(false)
   , maxUpdates(200)
   , nonzeroFactor(10.0)
   , fillFactor(5.0)
   , memFactor(1.5)
   , iterCount(0)
   , lastIterCount(0)
   , iterDegenCheck(0)
   , updateCount(0)
   , totalUpdateCount(0)
   , nzCount(1)
   , lastMem(0)
   , lastFill(0)
   , lastNzCount(0)
   , theTime(nullptr)
   , timerType(ttype)
   , lastidx(0)
   , minStab(0.0)
   , thestatus(NO_PROBLEM)
   , freeSlinSolver(false)
   , spxout(nullptr)
{
   // info: is not consistent at this moment, e.g. because theLP == 0

   theTime = TimerFactory::createTimer(timerType);
}